

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O3

vector_type * __thiscall
Disa::Vector_Dense<double,0ul>::operator-=
          (Vector_Dense<double,0ul> *this,Vector_Dense<double,_0UL> *vector)

{
  long lVar1;
  pointer pdVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  size_type *local_e8;
  size_type local_e0;
  size_type local_d8;
  undefined8 uStack_d0;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *(long *)this;
  location = (source_location *)(*(long *)(this + 8) - lVar1);
  pdVar2 = (vector->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (location ==
      (source_location *)
      ((long)(vector->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish - (long)pdVar2)) {
    if (*(long *)(this + 8) != lVar1) {
      lVar6 = 0;
      do {
        *(double *)(lVar1 + lVar6 * 8) = *(double *)(lVar1 + lVar6 * 8) - pdVar2[lVar6];
        lVar6 = lVar6 + 1;
      } while (((long)location >> 3) + (ulong)((long)location >> 3 == 0) != lVar6);
    }
    return (vector_type *)this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_48 = &PTR_s__workspace_llm4binary_github_lic_00184348;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__cxx11::to_string(&local_a8,*(long *)(this + 8) - *(long *)this >> 3);
  std::operator+(&local_88,"Incompatible vector sizes, ",&local_a8);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_88," vs. ");
  local_108._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p == paVar5) {
    local_108.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  }
  else {
    local_108.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_108._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string
            (&local_c8,
             (long)(vector->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_68,&local_108,&local_c8);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,".");
  local_e8 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8 == paVar5) {
    local_d8 = paVar5->_M_allocated_capacity;
    uStack_d0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_e8 = &local_d8;
  }
  else {
    local_d8 = paVar5->_M_allocated_capacity;
  }
  local_e0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_e8,local_e0);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(this->size() == vector.size(), "Incompatible vector sizes, " + std::to_string(this->size()) + " vs. " +
                                                std::to_string(vector.size()) + ".");
    FOR(index, this->size())(*this)[index] -= vector[index];
    return *this;
  }